

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

int ssh_sftp_do_select(_Bool include_stdin,_Bool no_fds_ok)

{
  ssh_sftp_mainloop_ctx ctx [1];
  undefined1 local_10;
  undefined1 local_f;
  int local_c;
  
  local_c = 0;
  local_10 = include_stdin;
  local_f = no_fds_ok;
  cli_main_loop(ssh_sftp_pw_setup,ssh_sftp_pw_check,ssh_sftp_mainloop_continue,&local_10);
  return local_c;
}

Assistant:

static int ssh_sftp_do_select(bool include_stdin, bool no_fds_ok)
{
    struct ssh_sftp_mainloop_ctx ctx[1];
    ctx->include_stdin = include_stdin;
    ctx->no_fds_ok = no_fds_ok;
    ctx->toret = 0;

    cli_main_loop(ssh_sftp_pw_setup, ssh_sftp_pw_check,
                  ssh_sftp_mainloop_continue, ctx);

    return ctx->toret;
}